

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressure.cpp
# Opt level: O1

RTPressure * RTPressure::createPressure(RTIMUSettings *settings)

{
  bool bVar1;
  RTPressureBMP180 *this;
  
  this = (RTPressureBMP180 *)0x0;
  while( true ) {
    if (settings->m_pressureType != 0) {
      switch(settings->m_pressureType) {
      case 2:
        this = (RTPressureBMP180 *)operator_new(0x58);
        RTPressureBMP180::RTPressureBMP180(this,settings);
        break;
      case 3:
        this = (RTPressureBMP180 *)operator_new(0x20);
        RTPressureLPS25H::RTPressureLPS25H((RTPressureLPS25H *)this,settings);
        break;
      case 4:
        this = (RTPressureBMP180 *)operator_new(0x48);
        RTPressureMS5611::RTPressureMS5611((RTPressureMS5611 *)this,settings);
        break;
      case 5:
        this = (RTPressureBMP180 *)operator_new(0x48);
        RTPressureMS5637::RTPressureMS5637((RTPressureMS5637 *)this,settings);
      }
      return &this->super_RTPressure;
    }
    bVar1 = RTIMUSettings::discoverPressure
                      (settings,&settings->m_pressureType,&settings->m_I2CPressureAddress);
    if (!bVar1) break;
    (*(settings->super_RTIMUHal)._vptr_RTIMUHal[3])(settings);
  }
  return (RTPressure *)0x0;
}

Assistant:

RTPressure *RTPressure::createPressure(RTIMUSettings *settings)
{
    switch (settings->m_pressureType) {
    case RTPRESSURE_TYPE_BMP180:
        return new RTPressureBMP180(settings);

    case RTPRESSURE_TYPE_LPS25H:
        return new RTPressureLPS25H(settings);

    case RTPRESSURE_TYPE_MS5611:
        return new RTPressureMS5611(settings);

    case RTPRESSURE_TYPE_MS5637:
        return new RTPressureMS5637(settings);

    case RTPRESSURE_TYPE_AUTODISCOVER:
        if (settings->discoverPressure(settings->m_pressureType, settings->m_I2CPressureAddress)) {
            settings->saveSettings();
            return RTPressure::createPressure(settings);
        }
        return NULL;

    case RTPRESSURE_TYPE_NULL:
        return NULL;

    default:
        return NULL;
    }
}